

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean emit_restart_s(working_state *state,int restart_num)

{
  JOCTET *pJVar1;
  boolean bVar2;
  size_t sVar3;
  int local_20;
  int ci;
  int restart_num_local;
  working_state *state_local;
  
  bVar2 = flush_bits_s(state);
  if (bVar2 == 0) {
    state_local._4_4_ = 0;
  }
  else {
    pJVar1 = state->next_output_byte;
    state->next_output_byte = pJVar1 + 1;
    *pJVar1 = 0xff;
    sVar3 = state->free_in_buffer - 1;
    state->free_in_buffer = sVar3;
    if ((sVar3 == 0) && (bVar2 = dump_buffer_s(state), bVar2 == 0)) {
      state_local._4_4_ = 0;
    }
    else {
      pJVar1 = state->next_output_byte;
      state->next_output_byte = pJVar1 + 1;
      *pJVar1 = (char)restart_num + 0xd0;
      sVar3 = state->free_in_buffer - 1;
      state->free_in_buffer = sVar3;
      if ((sVar3 == 0) && (bVar2 = dump_buffer_s(state), bVar2 == 0)) {
        state_local._4_4_ = 0;
      }
      else {
        for (local_20 = 0; local_20 < state->cinfo->comps_in_scan; local_20 = local_20 + 1) {
          (state->cur).last_dc_val[local_20] = 0;
        }
        state_local._4_4_ = 1;
      }
    }
  }
  return state_local._4_4_;
}

Assistant:

LOCAL(boolean)
emit_restart_s (working_state * state, int restart_num)
{
  int ci;

  if (! flush_bits_s(state))
    return FALSE;

  emit_byte_s(state, 0xFF, return FALSE);
  emit_byte_s(state, JPEG_RST0 + restart_num, return FALSE);

  /* Re-initialize DC predictions to 0 */
  for (ci = 0; ci < state->cinfo->comps_in_scan; ci++)
    state->cur.last_dc_val[ci] = 0;

  /* The restart counter is not updated until we successfully write the MCU. */

  return TRUE;
}